

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestLaunch.cxx
# Opt level: O2

bool __thiscall cmCTestLaunch::ScrapeLog(cmCTestLaunch *this,string *fname)

{
  bool bVar1;
  bool bVar2;
  cmCTestLaunch *this_00;
  string line;
  ifstream fin;
  
  LoadScrapeRules(this);
  std::ifstream::ifstream((istream *)&fin,(fname->_M_dataplus)._M_p,_S_in|_S_bin);
  line._M_dataplus._M_p = (pointer)&line.field_2;
  line._M_string_length = 0;
  line.field_2._M_local_buf[0] = '\0';
  do {
    do {
      do {
        bVar1 = cmsys::SystemTools::GetLineFromStream((istream *)&fin,&line,(bool *)0x0,-1);
        if (!bVar1) goto LAB_00174523;
        this_00 = this;
        bVar2 = MatchesFilterPrefix(this,&line);
      } while (bVar2);
      bVar2 = Match(this_00,&line,&this->RegexWarning);
    } while (!bVar2);
    bVar2 = Match(this_00,&line,&this->RegexWarningSuppress);
  } while (bVar2);
LAB_00174523:
  std::__cxx11::string::~string((string *)&line);
  std::ifstream::~ifstream(&fin);
  return bVar1;
}

Assistant:

bool cmCTestLaunch::ScrapeLog(std::string const& fname)
{
  this->LoadScrapeRules();

  // Look for log file lines matching warning expressions but not
  // suppression expressions.
  cmsys::ifstream fin(fname.c_str(), std::ios::in | std::ios::binary);
  std::string line;
  while (cmSystemTools::GetLineFromStream(fin, line)) {
    if (MatchesFilterPrefix(line)) {
      continue;
    }

    if (this->Match(line, this->RegexWarning) &&
        !this->Match(line, this->RegexWarningSuppress)) {
      return true;
    }
  }
  return false;
}